

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

stbtt__buf stbtt__cid_get_glyph_subrs(stbtt_fontinfo *info,int glyph_index)

{
  uint uVar1;
  stbtt_uint8 sVar2;
  byte bVar3;
  stbtt_uint32 sVar4;
  stbtt_uint32 sVar5;
  stbtt__buf fontdict;
  stbtt__buf sVar6;
  int local_54;
  uint local_50;
  int i;
  int fdselector;
  int fmt;
  int v;
  int end;
  int start;
  int nranges;
  stbtt__buf fdselect;
  int glyph_index_local;
  stbtt_fontinfo *info_local;
  
  _start = (info->fdselect).data;
  fdselect.data = *(uchar **)&(info->fdselect).cursor;
  local_50 = 0xffffffff;
  fdselect.size = glyph_index;
  stbtt__buf_seek((stbtt__buf *)&start,0);
  sVar2 = stbtt__buf_get8((stbtt__buf *)&start);
  if (sVar2 == '\0') {
    stbtt__buf_skip((stbtt__buf *)&start,fdselect.size);
    bVar3 = stbtt__buf_get8((stbtt__buf *)&start);
    uVar1 = (uint)bVar3;
  }
  else {
    uVar1 = local_50;
    if (sVar2 == '\x03') {
      sVar4 = stbtt__buf_get((stbtt__buf *)&start,2);
      v = stbtt__buf_get((stbtt__buf *)&start,2);
      for (local_54 = 0; uVar1 = local_50, local_54 < (int)sVar4; local_54 = local_54 + 1) {
        bVar3 = stbtt__buf_get8((stbtt__buf *)&start);
        sVar5 = stbtt__buf_get((stbtt__buf *)&start,2);
        if ((v <= fdselect.size) && (uVar1 = (uint)bVar3, fdselect.size < (int)sVar5)) break;
        v = sVar5;
      }
    }
  }
  local_50 = uVar1;
  if (local_50 == 0xffffffff) {
    stbtt__new_buf((void *)0x0,0);
  }
  sVar6 = info->cff;
  fontdict = stbtt__cff_index_get(info->fontdicts,local_50);
  sVar6 = stbtt__get_subrs(sVar6,fontdict);
  return sVar6;
}

Assistant:

static stbtt__buf stbtt__cid_get_glyph_subrs(const stbtt_fontinfo *info, int glyph_index)
{
   stbtt__buf fdselect = info->fdselect;
   int nranges, start, end, v, fmt, fdselector = -1, i;

   stbtt__buf_seek(&fdselect, 0);
   fmt = stbtt__buf_get8(&fdselect);
   if (fmt == 0) {
      // untested
      stbtt__buf_skip(&fdselect, glyph_index);
      fdselector = stbtt__buf_get8(&fdselect);
   } else if (fmt == 3) {
      nranges = stbtt__buf_get16(&fdselect);
      start = stbtt__buf_get16(&fdselect);
      for (i = 0; i < nranges; i++) {
         v = stbtt__buf_get8(&fdselect);
         end = stbtt__buf_get16(&fdselect);
         if (glyph_index >= start && glyph_index < end) {
            fdselector = v;
            break;
         }
         start = end;
      }
   }
   if (fdselector == -1) stbtt__new_buf(NULL, 0);
   return stbtt__get_subrs(info->cff, stbtt__cff_index_get(info->fontdicts, fdselector));
}